

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

Symbol * __thiscall slang::ast::Expression::getSymbolReference(Expression *this,bool allowPacked)

{
  byte bVar1;
  bool bVar2;
  ValueExpressionBase *pVVar3;
  ElementSelectExpression *this_00;
  Expression *pEVar4;
  RangeSelectExpression *this_01;
  MemberAccessExpression *this_02;
  ConversionExpression *this_03;
  AssignmentExpression *this_04;
  AssignmentExpression *this_05;
  byte in_SIL;
  Expression *in_RDI;
  AssignmentExpression *assign;
  ConversionExpression *conv;
  Expression *val_2;
  MemberAccessExpression *access;
  Expression *val_1;
  Expression *val;
  Type *in_stack_ffffffffffffff98;
  ValueSymbol *local_60;
  undefined8 in_stack_ffffffffffffffe0;
  undefined1 uVar5;
  undefined7 in_stack_ffffffffffffffe8;
  ValueSymbol *local_8;
  
  uVar5 = (undefined1)((ulong)in_stack_ffffffffffffffe0 >> 0x38);
  bVar1 = in_SIL & 1;
  this_05 = (AssignmentExpression *)(ulong)(in_RDI->kind - NamedValue);
  switch(this_05) {
  case (AssignmentExpression *)0x0:
  case (AssignmentExpression *)0x1:
    pVVar3 = as<slang::ast::ValueExpressionBase>(in_RDI);
    local_8 = pVVar3->symbol;
    break;
  default:
    local_8 = (ValueSymbol *)0x0;
    break;
  case (AssignmentExpression *)0x6:
    this_04 = as<slang::ast::AssignmentExpression>(in_RDI);
    bVar2 = AssignmentExpression::isLValueArg(this_05);
    if (bVar2) {
      AssignmentExpression::left(this_04);
      local_8 = (ValueSymbol *)
                getSymbolReference((Expression *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),
                                   (bool)uVar5);
    }
    else {
      local_8 = (ValueSymbol *)0x0;
    }
    break;
  case (AssignmentExpression *)0xa:
    this_00 = as<slang::ast::ElementSelectExpression>(in_RDI);
    pEVar4 = ElementSelectExpression::value(this_00);
    uVar5 = (undefined1)((ulong)pEVar4 >> 0x38);
    if ((bVar1 & 1) == 0) {
      not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x434dca)
      ;
      bVar2 = Type::isUnpackedArray(in_stack_ffffffffffffff98);
      if (bVar2) goto LAB_00434dd8;
      local_60 = (ValueSymbol *)0x0;
    }
    else {
LAB_00434dd8:
      local_60 = (ValueSymbol *)
                 getSymbolReference((Expression *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),
                                    (bool)uVar5);
    }
    local_8 = local_60;
    break;
  case (AssignmentExpression *)0xb:
    this_01 = as<slang::ast::RangeSelectExpression>(in_RDI);
    RangeSelectExpression::value(this_01);
    if ((bVar1 & 1) == 0) {
      not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x434e32)
      ;
      bVar2 = Type::isUnpackedArray(in_stack_ffffffffffffff98);
      if (!bVar2) {
        return (Symbol *)0x0;
      }
    }
    local_8 = (ValueSymbol *)
              getSymbolReference((Expression *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),(bool)uVar5
                                );
    break;
  case (AssignmentExpression *)0xc:
    this_02 = as<slang::ast::MemberAccessExpression>(in_RDI);
    MemberAccessExpression::value(this_02);
    if ((bVar1 & 1) == 0) {
      not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x434e9e)
      ;
      bVar2 = Type::isClass((Type *)0x434ea6);
      if (!bVar2) {
        not_null<const_slang::ast::Type_*>::operator->
                  ((not_null<const_slang::ast::Type_*> *)0x434eb8);
        bVar2 = Type::isUnpackedStruct((Type *)0x434ec0);
        if (!bVar2) {
          not_null<const_slang::ast::Type_*>::operator->
                    ((not_null<const_slang::ast::Type_*> *)0x434ed2);
          bVar2 = Type::isUnpackedUnion((Type *)0x434eda);
          if (!bVar2) {
            return (Symbol *)0x0;
          }
        }
      }
    }
    local_8 = (ValueSymbol *)this_02->member;
    break;
  case (AssignmentExpression *)0xe:
    this_03 = as<slang::ast::ConversionExpression>(in_RDI);
    bVar2 = ConversionExpression::isImplicit(this_03);
    if (bVar2) {
      ConversionExpression::operand(this_03);
      local_8 = (ValueSymbol *)
                getSymbolReference((Expression *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),
                                   (bool)uVar5);
    }
    else {
      local_8 = (ValueSymbol *)0x0;
    }
    break;
  case (AssignmentExpression *)0x11:
    as<slang::ast::ArbitrarySymbolExpression>(in_RDI);
    local_8 = (ValueSymbol *)
              not_null::operator_cast_to_Symbol_((not_null<const_slang::ast::Symbol_*> *)0x434f17);
  }
  return &local_8->super_Symbol;
}

Assistant:

const Symbol* Expression::getSymbolReference(bool allowPacked) const {
    switch (kind) {
        case ExpressionKind::NamedValue:
        case ExpressionKind::HierarchicalValue:
            return &as<ValueExpressionBase>().symbol;
        case ExpressionKind::ElementSelect: {
            auto& val = as<ElementSelectExpression>().value();
            return (allowPacked || val.type->isUnpackedArray()) ? val.getSymbolReference()
                                                                : nullptr;
        }
        case ExpressionKind::RangeSelect: {
            auto& val = as<RangeSelectExpression>().value();
            return (allowPacked || val.type->isUnpackedArray()) ? val.getSymbolReference()
                                                                : nullptr;
        }
        case ExpressionKind::MemberAccess: {
            auto& access = as<MemberAccessExpression>();
            auto& val = access.value();
            if (allowPacked || val.type->isClass() || val.type->isUnpackedStruct() ||
                val.type->isUnpackedUnion()) {
                return &access.member;
            }
            return nullptr;
        }
        case ExpressionKind::ArbitrarySymbol:
            return as<ArbitrarySymbolExpression>().symbol;
        case ExpressionKind::Conversion: {
            auto& conv = as<ConversionExpression>();
            if (conv.isImplicit())
                return conv.operand().getSymbolReference(allowPacked);
            return nullptr;
        }
        case ExpressionKind::Assignment: {
            auto& assign = as<AssignmentExpression>();
            if (assign.isLValueArg())
                return assign.left().getSymbolReference(allowPacked);
            return nullptr;
        }
        default:
            return nullptr;
    }
}